

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O0

int bcf_get_format_values(bcf_hdr_t *hdr,bcf1_t *line,char *tag,void **dst,int *ndst,int type)

{
  bcf_fmt_t *pbVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  void *pvVar5;
  uint8_t *local_a0;
  float *p_3;
  float *tmp_3;
  int32_t *p_2;
  int32_t *tmp_2;
  int16_t *p_1;
  int32_t *tmp_1;
  int8_t *p;
  int32_t *tmp;
  int size1;
  int nsmpl;
  int n;
  bcf_fmt_t *fmt;
  int tag_id;
  int j;
  int i;
  int type_local;
  int *ndst_local;
  void **dst_local;
  char *tag_local;
  bcf1_t *line_local;
  bcf_hdr_t *hdr_local;
  
  iVar3 = bcf_hdr_id2int(hdr,0,tag);
  if ((iVar3 < 0) || (((hdr->id[0][iVar3].val)->info[2] & 0xf) == 0xf)) {
    hdr_local._4_4_ = -1;
  }
  else {
    if (((*tag == 'G') && (tag[1] == 'T')) && (tag[2] == '\0')) {
      if (((hdr->id[0][iVar3].val)->info[2] >> 4 & 0xf) != 3) {
        return -2;
      }
    }
    else if (((hdr->id[0][iVar3].val)->info[2] >> 4 & 0xf) != type) {
      return -2;
    }
    if ((line->unpacked & 8U) == 0) {
      bcf_unpack(line,8);
    }
    tag_id = 0;
    while ((iVar2 = tag_id,
           tag_id < (int)((uint)((ulong)*(undefined8 *)&line->field_0x10 >> 0x20) & 0xff) &&
           ((line->d).fmt[tag_id].id != iVar3))) {
      tag_id = tag_id + 1;
    }
    if (tag_id == ((uint)((ulong)*(undefined8 *)&line->field_0x10 >> 0x20) & 0xff)) {
      hdr_local._4_4_ = -3;
    }
    else {
      pbVar1 = (line->d).fmt;
      if (type == 3) {
        hdr_local._4_4_ = pbVar1[tag_id].n * hdr->n[2];
        if (*ndst < hdr_local._4_4_) {
          pvVar5 = realloc(*dst,(long)hdr_local._4_4_);
          *dst = pvVar5;
          if (*dst == (void *)0x0) {
            return -4;
          }
          *ndst = hdr_local._4_4_;
        }
        memcpy(*dst,pbVar1[tag_id].p,(long)hdr_local._4_4_);
      }
      else {
        iVar3 = hdr->n[2];
        if (*ndst < pbVar1[tag_id].n * iVar3) {
          *ndst = pbVar1[tag_id].n * iVar3;
          pvVar5 = realloc(*dst,(long)(*ndst * 4));
          *dst = pvVar5;
          if (dst == (void **)0x0) {
            return -4;
          }
        }
        switch(pbVar1[tag_id].type) {
        case 1:
          p = (int8_t *)*dst;
          tmp_1 = (int32_t *)pbVar1[tag_id].p;
          for (tag_id = 0; tag_id < iVar3; tag_id = tag_id + 1) {
            for (fmt._4_4_ = 0; fmt._4_4_ < pbVar1[iVar2].n; fmt._4_4_ = fmt._4_4_ + 1) {
              if (*(char *)((long)tmp_1 + (long)fmt._4_4_) == -0x80) {
                p[0] = '\0';
                p[1] = '\0';
                p[2] = '\0';
                p[3] = -0x80;
              }
              else {
                if (*(char *)((long)tmp_1 + (long)fmt._4_4_) == -0x7f) {
                  p[0] = '\x01';
                  p[1] = '\0';
                  p[2] = '\0';
                  p[3] = -0x80;
                  break;
                }
                *(int *)p = (int)*(char *)((long)tmp_1 + (long)fmt._4_4_);
              }
              p = p + 4;
            }
            for (; fmt._4_4_ < pbVar1[iVar2].n; fmt._4_4_ = fmt._4_4_ + 1) {
              p[0] = '\x01';
              p[1] = '\0';
              p[2] = '\0';
              p[3] = -0x80;
              p = p + 4;
            }
            tmp_1 = (int32_t *)((long)tmp_1 + (long)pbVar1[iVar2].size);
          }
          break;
        case 2:
          p_1 = (int16_t *)*dst;
          tmp_2 = (int32_t *)pbVar1[tag_id].p;
          for (tag_id = 0; tag_id < iVar3; tag_id = tag_id + 1) {
            for (fmt._4_4_ = 0; fmt._4_4_ < pbVar1[iVar2].n; fmt._4_4_ = fmt._4_4_ + 1) {
              if (*(short *)((long)tmp_2 + (long)fmt._4_4_ * 2) == -0x8000) {
                p_1[0] = 0;
                p_1[1] = -0x8000;
              }
              else {
                if (*(short *)((long)tmp_2 + (long)fmt._4_4_ * 2) == -0x7fff) {
                  p_1[0] = 1;
                  p_1[1] = -0x8000;
                  break;
                }
                *(int *)p_1 = (int)*(short *)((long)tmp_2 + (long)fmt._4_4_ * 2);
              }
              p_1 = p_1 + 2;
            }
            for (; fmt._4_4_ < pbVar1[iVar2].n; fmt._4_4_ = fmt._4_4_ + 1) {
              p_1[0] = 1;
              p_1[1] = -0x8000;
              p_1 = p_1 + 2;
            }
            tmp_2 = (int32_t *)((long)tmp_2 + (long)pbVar1[iVar2].size);
          }
          break;
        case 3:
          p_2 = (int32_t *)*dst;
          tmp_3 = (float *)pbVar1[tag_id].p;
          for (tag_id = 0; tag_id < iVar3; tag_id = tag_id + 1) {
            for (fmt._4_4_ = 0; fmt._4_4_ < pbVar1[iVar2].n; fmt._4_4_ = fmt._4_4_ + 1) {
              if (tmp_3[fmt._4_4_] == -0.0) {
                *p_2 = -0x80000000;
              }
              else {
                if (tmp_3[fmt._4_4_] == -1.4013e-45) {
                  *p_2 = -0x7fffffff;
                  break;
                }
                *p_2 = (int32_t)tmp_3[fmt._4_4_];
              }
              p_2 = p_2 + 1;
            }
            for (; fmt._4_4_ < pbVar1[iVar2].n; fmt._4_4_ = fmt._4_4_ + 1) {
              *p_2 = -0x7fffffff;
              p_2 = p_2 + 1;
            }
            tmp_3 = (float *)((long)tmp_3 + (long)pbVar1[iVar2].size);
          }
          break;
        default:
          fprintf(_stderr,"TODO: %s:%d .. fmt->type=%d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/vcf.c"
                  ,0xc87,(ulong)(uint)pbVar1[tag_id].type);
          exit(1);
        case 5:
          p_3 = (float *)*dst;
          local_a0 = pbVar1[tag_id].p;
          for (tag_id = 0; tag_id < iVar3; tag_id = tag_id + 1) {
            for (fmt._4_4_ = 0; fmt._4_4_ < pbVar1[iVar2].n; fmt._4_4_ = fmt._4_4_ + 1) {
              iVar4 = bcf_float_is_missing(*(float *)(local_a0 + (long)fmt._4_4_ * 4));
              if (iVar4 == 0) {
                iVar4 = bcf_float_is_vector_end(*(float *)(local_a0 + (long)fmt._4_4_ * 4));
                if (iVar4 != 0) {
                  bcf_float_set(p_3,bcf_float_vector_end);
                  break;
                }
                *p_3 = *(float *)(local_a0 + (long)fmt._4_4_ * 4);
              }
              else {
                bcf_float_set(p_3,bcf_float_missing);
              }
              p_3 = p_3 + 1;
            }
            for (; fmt._4_4_ < pbVar1[iVar2].n; fmt._4_4_ = fmt._4_4_ + 1) {
              bcf_float_set(p_3,bcf_float_vector_end);
              p_3 = p_3 + 1;
            }
            local_a0 = local_a0 + pbVar1[iVar2].size;
          }
        }
        hdr_local._4_4_ = iVar3 * pbVar1[iVar2].n;
      }
    }
  }
  return hdr_local._4_4_;
}

Assistant:

int bcf_get_format_values(const bcf_hdr_t *hdr, bcf1_t *line, const char *tag, void **dst, int *ndst, int type)
{
    int i,j, tag_id = bcf_hdr_id2int(hdr, BCF_DT_ID, tag);
    if ( !bcf_hdr_idinfo_exists(hdr,BCF_HL_FMT,tag_id) ) return -1;    // no such FORMAT field in the header
    if ( tag[0]=='G' && tag[1]=='T' && tag[2]==0 )
    {
        // Ugly: GT field is considered to be a string by the VCF header but BCF represents it as INT.
        if ( bcf_hdr_id2type(hdr,BCF_HL_FMT,tag_id)!=BCF_HT_STR ) return -2;
    }
    else if ( bcf_hdr_id2type(hdr,BCF_HL_FMT,tag_id)!=type ) return -2;     // expected different type

    if ( !(line->unpacked & BCF_UN_FMT) ) bcf_unpack(line, BCF_UN_FMT);

    for (i=0; i<line->n_fmt; i++)
        if ( line->d.fmt[i].id==tag_id ) break;
    if ( i==line->n_fmt ) return -3;                               // the tag is not present in this record
    bcf_fmt_t *fmt = &line->d.fmt[i];

    if ( type==BCF_HT_STR )
    {
        int n = fmt->n*bcf_hdr_nsamples(hdr);
        if ( *ndst < n )
        {
            *dst  = realloc(*dst, n);
            if ( !*dst ) return -4;     // could not alloc
            *ndst = n;
        }
        memcpy(*dst,fmt->p,n);
        return n;
    }

    // Make sure the buffer is big enough
    int nsmpl = bcf_hdr_nsamples(hdr);
    int size1 = type==BCF_HT_INT ? sizeof(int32_t) : sizeof(float);
    if ( *ndst < fmt->n*nsmpl )
    {
        *ndst = fmt->n*nsmpl;
        *dst  = realloc(*dst, *ndst*size1);
        if ( !dst ) return -4;     // could not alloc
    }

    #define BRANCH(type_t, is_missing, is_vector_end, set_missing, set_vector_end, out_type_t) { \
        out_type_t *tmp = (out_type_t *) *dst; \
        type_t *p = (type_t*) fmt->p; \
        for (i=0; i<nsmpl; i++) \
        { \
            for (j=0; j<fmt->n; j++) \
            { \
                if ( is_missing ) set_missing; \
                else if ( is_vector_end ) { set_vector_end; break; } \
                else *tmp = p[j]; \
                tmp++; \
            } \
            for (; j<fmt->n; j++) { set_vector_end; tmp++; } \
            p = (type_t *)((char *)p + fmt->size); \
        } \
    }
    switch (fmt->type) {
        case BCF_BT_INT8:  BRANCH(int8_t,  p[j]==bcf_int8_missing,  p[j]==bcf_int8_vector_end,  *tmp=bcf_int32_missing, *tmp=bcf_int32_vector_end, int32_t); break;
        case BCF_BT_INT16: BRANCH(int16_t, p[j]==bcf_int16_missing, p[j]==bcf_int16_vector_end, *tmp=bcf_int32_missing, *tmp=bcf_int32_vector_end, int32_t); break;
        case BCF_BT_INT32: BRANCH(int32_t, p[j]==bcf_int32_missing, p[j]==bcf_int32_vector_end, *tmp=bcf_int32_missing, *tmp=bcf_int32_vector_end, int32_t); break;
        case BCF_BT_FLOAT: BRANCH(float,   bcf_float_is_missing(p[j]), bcf_float_is_vector_end(p[j]), bcf_float_set_missing(*tmp), bcf_float_set_vector_end(*tmp), float); break;
        default: fprintf(stderr,"TODO: %s:%d .. fmt->type=%d\n", __FILE__,__LINE__, fmt->type); exit(1);
    }
    #undef BRANCH
    return nsmpl*fmt->n;
}